

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

bool WindowedKeyTest<Blob<130>,unsigned_long>
               (hashfunc<unsigned_long> hash,int windowbits,bool testCollision,bool testDistribution
               ,bool drawDiagram)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  Blob<130> key;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  int local_68 [4];
  undefined1 uStack_58;
  pfHash local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  uVar3 = 1 << (windowbits & 0x1fU);
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = hash.m_hash;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&local_48,(long)(int)uVar3);
  printf("Keyset \'Window\' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",0x88,
         (ulong)(uint)windowbits,0x88);
  uVar1 = 1;
  if (1 < (int)uVar3) {
    uVar1 = uVar3;
  }
  bVar4 = true;
  uVar3 = 0;
  do {
    local_68[0] = 0;
    local_68[1] = 0;
    local_68[2] = 0;
    local_68[3] = 0;
    uStack_58 = 0;
    if (windowbits != 0x1f) {
      iVar6 = 0;
      lVar5 = 0;
      do {
        local_68[3] = 0;
        uStack_58 = 0;
        local_68[1] = 0;
        local_68[2] = 0;
        local_68[0] = iVar6;
        lrot8(local_68,0x11,uVar3);
        (*local_50)(local_68,0x11,0,
                    (void *)((long)local_48.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar5));
        lVar5 = lVar5 + 8;
        iVar6 = iVar6 + 1;
      } while ((ulong)uVar1 * 8 != lVar5);
    }
    printf("Window at %3d - ",(ulong)uVar3);
    bVar2 = TestHashList<unsigned_long>
                      (&local_48,drawDiagram,testCollision,testDistribution,false,false);
    bVar4 = (bool)(bVar4 & bVar2);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x89);
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool WindowedKeyTest ( hashfunc<hashtype> hash, const int windowbits,
                       bool testCollision, bool testDistribution, bool drawDiagram )
{
  const int keybits = sizeof(keytype) * 8;
  const int keycount = 1 << windowbits;

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  bool result = true;

  int testcount = keybits;

  printf("Keyset 'Window' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",
         keybits,windowbits,testcount,keycount);

  for(int j = 0; j <= testcount; j++)
  {
    int minbit = j;

    keytype key;

    for(int i = 0; i < keycount; i++)
    {
      key = i;
      //key = key << minbit;

      lrot(&key,sizeof(keytype),minbit);

      hash(&key,sizeof(keytype),0,&hashes[i]);
    }

    printf("Window at %3d - ",j);

    result &= TestHashList(hashes, drawDiagram, testCollision, testDistribution,
                           /* do not test high/low bits (to not clobber the screen) */
                           false, false);

    //printf("\n");
  }

  return result;
}